

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O3

int32 ngram_search_prob(ps_search_t *search)

{
  ps_lattice_t *ppVar1;
  ps_latlink_t *ppVar2;
  int backward;
  int32 iVar3;
  
  iVar3 = 0;
  if ((*(char *)((long)&search[1].name + 2) != '\0') &&
     (iVar3 = 0, *(char *)((long)&search[1].name + 3) != '\0')) {
    ppVar1 = ngram_search_lattice(search);
    if (ppVar1 != (ps_lattice_t *)0x0) {
      iVar3 = 0;
      ppVar2 = ngram_search_bestpath(search,(int32 *)0x0,backward);
      if (ppVar2 != (ps_latlink_t *)0x0) {
        iVar3 = search->post;
      }
    }
  }
  return iVar3;
}

Assistant:

static int32
ngram_search_prob(ps_search_t *search)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    /* Only do bestpath search if the utterance is done. */
    if (ngs->bestpath && ngs->done) {
        ps_lattice_t *dag;
        ps_latlink_t *link;

        if ((dag = ngram_search_lattice(search)) == NULL)
            return 0;
        if ((link = ngram_search_bestpath(search, NULL, TRUE)) == NULL)
            return 0;
        return search->post;
    }
    else {
        /* FIXME: Give some kind of good estimate here, eventually. */
        return 0;
    }
}